

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O3

MouseEventResult __thiscall
QMenuSloppyState::processMouseEvent
          (QMenuSloppyState *this,QPointF *mousePos,QAction *resetAction,QAction *currentAction)

{
  long lVar1;
  double dVar2;
  byte bVar3;
  Data *pDVar4;
  qreal qVar5;
  qreal qVar6;
  long lVar7;
  char cVar8;
  LayoutDirection LVar9;
  int iVar10;
  short sVar11;
  MouseEventResult MVar12;
  long lVar13;
  long in_FS_OFFSET;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  double dVar19;
  uint uVar21;
  double dVar22;
  undefined1 auVar20 [16];
  double dVar23;
  double dVar24;
  double dVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  QList<QAction_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_parent != (QMenuSloppyState *)0x0) {
    QBasicTimer::stop();
  }
  MVar12 = EventShouldBePropagated;
  if ((this->field_0x6c & 1) == 0) goto LAB_004606eb;
  startTimerIfNotRunning(this);
  pDVar4 = (this->m_sub_menu).wp.d;
  if (((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) ||
     ((this->m_sub_menu).wp.value == (QObject *)0x0)) {
    reset(this);
    goto LAB_004606eb;
  }
  qVar5 = mousePos->xp;
  qVar6 = mousePos->yp;
  if (resetAction == (QAction *)0x0) {
LAB_00460585:
    if (this->m_reset_action != resetAction) {
      if ((resetAction != (QAction *)0x0) && ((this->field_0x6c & 0x20) != 0)) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
        QWidget::actions(&local_58,&this->m_menu->super_QWidget);
        if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
          uVar18 = 0xffffffff;
LAB_00460610:
          uVar21 = 0xffffffff;
        }
        else {
          lVar13 = -8;
          do {
            if (local_58.d.size * -8 + lVar13 == -8) {
              uVar18 = 0xffffffff;
              goto LAB_00460620;
            }
            lVar1 = lVar13 + 8;
            lVar7 = lVar13 + 8;
            lVar13 = lVar1;
          } while (*(QAction **)((long)local_58.d.ptr + lVar7) != resetAction);
          uVar18 = (uint)(lVar1 >> 3);
LAB_00460620:
          lVar13 = -8;
          do {
            if (local_58.d.size * -8 + lVar13 == -8) goto LAB_00460610;
            lVar1 = lVar13 + 8;
            lVar7 = lVar13 + 8;
            lVar13 = lVar1;
          } while (*(QAction **)((long)local_58.d.ptr + lVar7) != this->m_origin_action);
          uVar21 = (uint)(lVar1 >> 3);
        }
        if (-1 < (int)(uVar21 | uVar18)) {
          uVar18 = uVar18 - uVar21;
          uVar21 = -uVar18;
          if (0 < (int)uVar18) {
            uVar21 = uVar18;
          }
          if (1 < uVar21) {
            this->field_0x6c = this->field_0x6c & 0xdf;
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
          }
        }
      }
      this->m_reset_action = resetAction;
    }
  }
  else {
    cVar8 = QAction::isSeparator();
    if (cVar8 == '\0') goto LAB_00460585;
    this->m_reset_action = (QAction *)0x0;
    this->field_0x6c = this->field_0x6c | 0x20;
  }
  cVar8 = QRectF::contains((QPointF *)&this->m_action_rect);
  bVar3 = this->field_0x6c;
  uVar14 = (ulong)bVar3;
  if (cVar8 == '\0') {
    if ((((bVar3 & 2) != 0) && (this->m_first_mouse == false)) &&
       (this->m_origin_action != resetAction)) {
      LVar9 = QWidget::layoutDirection(&this->m_menu->super_QWidget);
      lVar13 = *(long *)((this->m_sub_menu).wp.value + 0x20);
      dVar31 = (this->m_previous_point).xp;
      dVar23 = (this->m_previous_point).yp;
      dVar2 = mousePos->yp;
      iVar10 = (int)(dVar23 - dVar2);
      uVar18 = (int)((uint)(LVar9 == LeftToRight) << 0x1f) >> 0x1f;
      uVar21 = (int)((uint)(LVar9 == LeftToRight) << 0x1f) >> 0x1f;
      dVar24 = (double)(int)(~uVar18 & *(uint *)(lVar13 + 0x1c) | *(uint *)(lVar13 + 0x14) & uVar18)
      ;
      dVar27 = (double)(int)(~uVar21 & *(uint *)(lVar13 + 0x1c) | *(uint *)(lVar13 + 0x14) & uVar21)
      ;
      dVar19 = (double)*(int *)(lVar13 + 0x18);
      dVar22 = (double)*(int *)(lVar13 + 0x20);
      dVar30 = dVar24 - dVar31;
      dVar31 = dVar27 - dVar31;
      auVar32._0_8_ = dVar19 - dVar23;
      auVar32._8_8_ = dVar22 - dVar23;
      uVar14 = -(ulong)(dVar30 < -dVar30);
      uVar15 = -(ulong)(dVar31 < -dVar31);
      uVar14 = -(ulong)((double)(~uVar14 & (ulong)dVar30 | (ulong)-dVar30 & uVar14) <= 1e-12);
      uVar15 = -(ulong)((double)(~uVar15 & (ulong)dVar31 | (ulong)-dVar31 & uVar15) <= 1e-12);
      auVar33._8_8_ = dVar31;
      auVar33._0_8_ = dVar30;
      auVar33 = divpd(auVar32,auVar33);
      dVar30 = (double)(~uVar14 & auVar33._0_8_ | uVar14 & 0x40c3878000000000);
      dVar28 = (double)(~uVar15 & auVar33._8_8_ | uVar15 & 0x40c3878000000000);
      auVar25._0_8_ = dVar24 - mousePos->xp;
      auVar25._8_8_ = dVar27 - mousePos->xp;
      auVar29._0_8_ = dVar19 - dVar2;
      auVar29._8_8_ = dVar22 - dVar2;
      uVar14 = -(ulong)(auVar25._0_8_ < -auVar25._0_8_);
      uVar15 = -(ulong)(auVar25._8_8_ < -auVar25._8_8_);
      uVar14 = -(ulong)((double)(~uVar14 & (ulong)auVar25._0_8_ | (ulong)-auVar25._0_8_ & uVar14) <=
                       1e-12);
      uVar15 = -(ulong)((double)(~uVar15 & (ulong)auVar25._8_8_ | (ulong)-auVar25._8_8_ & uVar15) <=
                       1e-12);
      auVar33 = divpd(auVar29,auVar25);
      dVar23 = (double)(~uVar14 & auVar33._0_8_ | uVar14 & 0x40c3878000000000);
      dVar31 = (double)(~uVar15 & auVar33._8_8_ | uVar15 & 0x40c3878000000000);
      auVar26._0_8_ = -(ulong)(dVar30 <= dVar23 && dVar19 < dVar2);
      auVar26._8_8_ = -(ulong)(dVar28 <= dVar31 && dVar2 < dVar22);
      auVar20._0_8_ = ~-(ulong)(dVar19 < dVar2) & -(ulong)(dVar23 <= dVar30);
      auVar20._8_8_ = ~-(ulong)(dVar2 < dVar22) & -(ulong)(dVar31 <= dVar28);
      auVar16._0_4_ = -(uint)(-1 < iVar10);
      auVar16._4_4_ = -(uint)(0 < iVar10);
      auVar16._8_4_ = -(uint)(iVar10 < 1);
      auVar16._12_4_ = 0xffffffff;
      auVar16 = auVar16 & (auVar20 | auVar26);
      auVar17._0_8_ = auVar16._0_8_ << 0x3f;
      auVar17._8_8_ = auVar16._8_8_ << 0x3f;
      iVar10 = movmskpd(iVar10,auVar17);
      if ((this->m_uni_dir_fail_at_count <= this->m_uni_dir_discarded_count) && (iVar10 == 0)) {
        this->m_uni_dir_discarded_count = 0;
        MVar12 = EventDiscardsSloppyState;
        goto LAB_004606df;
      }
      sVar11 = 0;
      if (iVar10 == 0) {
        sVar11 = this->m_uni_dir_discarded_count + 1;
      }
      this->m_uni_dir_discarded_count = sVar11;
      uVar14 = (ulong)(byte)this->field_0x6c;
    }
    MVar12 = (MouseEventResult)((byte)(uVar14 >> 2) & 1);
  }
  else {
    if ((bVar3 & 1) != 0) {
      QBasicTimer::start(&this->m_time,(long)this->m_timeout * 1000000,1,this->m_menu);
    }
    MVar12 = (MouseEventResult)
             (*(QAction **)(*(long *)&(this->m_menu->super_QWidget).field_0x8 + 0x3a8) !=
             currentAction);
  }
LAB_004606df:
  (this->m_previous_point).xp = qVar5;
  (this->m_previous_point).yp = qVar6;
  this->m_first_mouse = false;
LAB_004606eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return MVar12;
  }
  __stack_chk_fail();
}

Assistant:

MouseEventResult processMouseEvent(const QPointF &mousePos, QAction *resetAction, QAction *currentAction)
    {
        if (m_parent)
            m_parent->stopTimer();

        if (!m_enabled)
            return EventShouldBePropagated;

        startTimerIfNotRunning();

        if (!m_sub_menu) {
            reset();
            return EventShouldBePropagated;
        }

        QSetValueOnDestroy<bool> setFirstMouse(m_first_mouse, false);
        QSetValueOnDestroy<QPointF> setPreviousPoint(m_previous_point, mousePos);

        if (resetAction && resetAction->isSeparator()) {
            m_reset_action = nullptr;
            m_use_reset_action = true;
        } else if (m_reset_action != resetAction) {
            if (m_use_reset_action && resetAction) {
                const QList<QAction *> actions = m_menu->actions();
                const int resetIdx  = actions.indexOf(resetAction);
                const int originIdx = actions.indexOf(m_origin_action);
                if (resetIdx > -1 && originIdx > -1 && qAbs(resetIdx - originIdx) > 1)
                    m_use_reset_action = false;
            }
            m_reset_action = resetAction;
        }

        if (m_action_rect.contains(mousePos)) {
            startTimer();
            return currentAction == m_menu->menuAction() ? EventIsProcessed : EventShouldBePropagated;
        }

        if (m_uni_directional && !m_first_mouse && resetAction != m_origin_action) {
            bool left_to_right = m_menu->layoutDirection() == Qt::LeftToRight;
            QRect sub_menu_rect = m_sub_menu->geometry();
            QPoint sub_menu_top =
                    left_to_right? sub_menu_rect.topLeft() : sub_menu_rect.topRight();
            QPoint sub_menu_bottom =
                    left_to_right? sub_menu_rect.bottomLeft() : sub_menu_rect.bottomRight();
            qreal prev_slope_top = slope(m_previous_point, sub_menu_top);
            qreal prev_slope_bottom = slope(m_previous_point, sub_menu_bottom);

            qreal current_slope_top = slope(mousePos, sub_menu_top);
            qreal current_slope_bottom = slope(mousePos, sub_menu_bottom);

            bool slopeTop = checkSlope(prev_slope_top, current_slope_top, sub_menu_top.y() < mousePos.y());
            bool slopeBottom = checkSlope(prev_slope_bottom, current_slope_bottom, sub_menu_bottom.y() > mousePos.y());
            bool rightDirection = false;
            int mouseDir = int(m_previous_point.y() - mousePos.y());
            if (mouseDir >= 0) {
                rightDirection = rightDirection || slopeTop;
            }
            if (mouseDir <= 0) {
                rightDirection = rightDirection || slopeBottom;
            }

            if (m_uni_dir_discarded_count >= m_uni_dir_fail_at_count && !rightDirection) {
                m_uni_dir_discarded_count = 0;
                return EventDiscardsSloppyState;
            }

            if (!rightDirection)
                m_uni_dir_discarded_count++;
            else
                m_uni_dir_discarded_count = 0;

        }

        return m_select_other_actions ? EventShouldBePropagated : EventIsProcessed;
    }